

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

UBool haveAliasData(UErrorCode *pErrorCode)

{
  UBool UVar1;
  UErrorCode *pErrorCode_local;
  
  icu_63::umtx_initOnce(&gAliasDataInitOnce,initAliasData,pErrorCode);
  UVar1 = U_SUCCESS(*pErrorCode);
  return UVar1;
}

Assistant:

static UBool
haveAliasData(UErrorCode *pErrorCode) {
    umtx_initOnce(gAliasDataInitOnce, &initAliasData, *pErrorCode);
    return U_SUCCESS(*pErrorCode);
}